

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O2

void update_val_from_objs(Am_Object *cmd,Am_Value *objs_value,Am_Value_List *new_list)

{
  Am_Get_Object_Property_Value_Method_Type *pAVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Object obj;
  Am_Value_List obj_list;
  Am_Value_List value_list;
  Am_Value old_value;
  undefined1 local_58 [8];
  undefined1 local_50 [8];
  Am_Get_Object_Property_Value_Method get_obj_val_method;
  
  get_obj_val_method.from_wrapper = (Am_Method_Wrapper *)0x0;
  get_obj_val_method.Call = (Am_Get_Object_Property_Value_Method_Type *)0x0;
  Am_Value_List::Am_Value_List(&value_list);
  Am_Value_List::Am_Value_List(&obj_list);
  old_value.type = 0;
  old_value.value.wrapper_value = (Am_Wrapper *)0x0;
  obj.data = (Am_Object_Data *)0x0;
  pAVar3 = Am_Object::Get(cmd,0x199,0);
  Am_Get_Object_Property_Value_Method::operator=(&get_obj_val_method,pAVar3);
  Am_Value_List::operator=(&obj_list,objs_value);
  Am_Value_List::Start(&value_list);
  Am_Value_List::Start(&obj_list);
  while( true ) {
    bVar2 = Am_Value_List::Last(&obj_list);
    if (bVar2) break;
    pAVar3 = Am_Value_List::Get(&obj_list);
    Am_Object::operator=(&obj,pAVar3);
    pAVar1 = get_obj_val_method.Call;
    Am_Object::Am_Object((Am_Object *)local_50,cmd);
    Am_Object::Am_Object((Am_Object *)local_58,&obj);
    (*pAVar1)((Am_Object_Data *)local_50,(Am_Object_Data *)local_58,&old_value);
    Am_Object::~Am_Object((Am_Object *)local_58);
    Am_Object::~Am_Object((Am_Object *)local_50);
    Am_Value_List::Add(&value_list,&old_value,Am_TAIL,true);
    Am_Value_List::Next(&obj_list);
  }
  Am_Value_List::operator=(new_list,&value_list);
  Am_Object::~Am_Object(&obj);
  Am_Value::~Am_Value(&old_value);
  Am_Value_List::~Am_Value_List(&obj_list);
  Am_Value_List::~Am_Value_List(&value_list);
  return;
}

Assistant:

void
update_val_from_objs(Am_Object cmd, Am_Value objs_value,
                     Am_Value_List &new_list)
{
  Am_Get_Object_Property_Value_Method get_obj_val_method;
  Am_Value_List value_list, obj_list;
  Am_Value old_value;
  Am_Object obj;
  get_obj_val_method = cmd.Get(Am_GET_OBJECT_VALUE_METHOD);
  obj_list = objs_value;
  value_list.Start();
  for (obj_list.Start(); !obj_list.Last(); obj_list.Next()) {
    obj = obj_list.Get();
    get_obj_val_method.Call(cmd, obj, old_value);
    value_list.Add(old_value);
  }
  //std::cout << "update val for " << objs_value << " to " << value_list
  // <<std::endl <<std::flush;
  new_list = value_list;
}